

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

flatcc_builder_ref_t
flatcc_builder_create_table
          (flatcc_builder_t *B,void *data,size_t size,uint16_t align,flatbuffers_voffset_t *offsets,
          int offset_count,flatcc_builder_vt_ref_t vt_ref)

{
  ushort uVar1;
  uint uVar2;
  flatcc_builder_ref_t fVar3;
  int iVar4;
  ulong uVar5;
  flatbuffers_uoffset_t vt_offset_field;
  flatcc_iov_state_t local_a0;
  
  if (offset_count < 0) {
    __assert_fail("offset_count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x4ea,
                  "flatcc_builder_ref_t flatcc_builder_create_table(flatcc_builder_t *, const void *, size_t, uint16_t, flatbuffers_voffset_t *, int, flatcc_builder_vt_ref_t)"
                 );
  }
  if ((vt_ref & 1U) != 0) {
    uVar1 = 4;
    if (4 < align) {
      uVar1 = align;
    }
    if (B->min_align < uVar1) {
      B->min_align = uVar1;
    }
    uVar2 = uVar1 - 1 & B->emit_start - (int)size;
    iVar4 = (B->emit_start - (uVar2 + (int)size)) + -4;
    vt_offset_field = (iVar4 - vt_ref) + 1;
    for (uVar5 = 0; (uint)offset_count != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = offsets[uVar5];
      *(uint *)((ulong)uVar1 + (long)data) =
           (*(int *)((ulong)uVar1 + (long)data) - ((uint)uVar1 + iVar4)) + -4;
    }
    local_a0.len = 4;
    local_a0.iov[0].iov_base = &vt_offset_field;
    local_a0.iov[0].iov_len = 4;
    local_a0.count = 1;
    if (size == 0) {
      iVar4 = 1;
    }
    else {
      local_a0.len = size + 4;
      local_a0.count = 2;
      iVar4 = 2;
      local_a0.iov[1].iov_base = data;
      local_a0.iov[1].iov_len = size;
    }
    if (uVar2 != 0) {
      local_a0.len = local_a0.len + uVar2;
      *(uint8_t **)((long)&local_a0.iov[0].iov_base + (ulong)(uint)(iVar4 << 4)) = "";
      *(ulong *)((long)&local_a0.iov[0].iov_len + (ulong)(uint)(iVar4 << 4)) = (ulong)uVar2;
      local_a0.count = iVar4 + 1;
    }
    fVar3 = emit_front(B,&local_a0);
    return fVar3;
  }
  __assert_fail("vt_ref & 1",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x4f0,
                "flatcc_builder_ref_t flatcc_builder_create_table(flatcc_builder_t *, const void *, size_t, uint16_t, flatbuffers_voffset_t *, int, flatcc_builder_vt_ref_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_table(flatcc_builder_t *B, const void *data, size_t size, uint16_t align,
        flatbuffers_voffset_t *offsets, int offset_count, flatcc_builder_vt_ref_t vt_ref)
{
    int i;
    uoffset_t pad, vt_offset, vt_offset_field, vt_base, base, offset, *offset_field;
    iov_state_t iov;

    check(offset_count >= 0, "expected non-negative offset_count");
    /*
     * vtable references are offset by 1 to avoid confusion with
     * 0 as an error reference. It also uniquely identifies them
     * as vtables being the only uneven reference type.
     */
    check(vt_ref & 1, "invalid vtable referenc");
    get_min_align(&align, field_size);
    set_min_align(B, align);
    /* Alignment is calculated for the first element, not the header. */
    pad = front_pad(B, (uoffset_t)size, align);
    base = (uoffset_t)B->emit_start - (uoffset_t)(pad + size + field_size);
    /* Adjust by 1 to get unencoded vtable reference. */
    vt_base = (uoffset_t)(vt_ref - 1);
    vt_offset = base - vt_base;
    /* Avoid overflow. */
    if (base - vt_offset != vt_base) {
        return -1;
    }
    /* Protocol endian encoding. */
    write_uoffset(&vt_offset_field, vt_offset);
    for (i = 0; i < offset_count; ++i) {
        offset_field = (uoffset_t *)((size_t)data + offsets[i]);
        offset = *offset_field - base - offsets[i] - (uoffset_t)field_size;
        write_uoffset(offset_field, offset);
    }
    init_iov();
    push_iov(&vt_offset_field, field_size);
    push_iov(data, size);
    push_iov(_pad, pad);
    return emit_front(B, &iov);
}